

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::tree_node<char,_true>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<char,true,5>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<char,_true>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  int *piVar1;
  atomic<unsigned_int> *paVar2;
  internal_node<char,_true> *p_node;
  uint32_t *puVar3;
  rrb_size_table<true> *__ptr;
  byte bVar4;
  undefined4 *__ptr_00;
  internal_node<char,_true> *piVar5;
  rrb_size_table<true> *prVar6;
  rrb_size_table<true> *prVar7;
  ulong uVar8;
  ulong uVar9;
  char *__function;
  uint32_t uVar10;
  uint32_t uVar11;
  long lVar12;
  uint uVar13;
  uint32_t uVar14;
  ref<immutable::rrb_details::internal_node<char,_true>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_true>_> left_hand_node;
  ref<immutable::rrb_details::tree_node<char,_true>_> child;
  ref<immutable::rrb_details::internal_node<char,_true>_> local_58;
  ref<immutable::rrb_details::tree_node<char,_true>_> local_50;
  uint32_t local_44;
  ref<immutable::rrb_details::tree_node<char,_true>_> local_40;
  tree_node<char,_true> *local_38;
  
  bVar4 = (byte)shift;
  uVar13 = left >> (bVar4 & 0x1f);
  uVar9 = (ulong)uVar13;
  p_node = (internal_node<char,_true> *)root->ptr;
  if (shift == 0) {
    if (p_node != (internal_node<char,_true> *)0x0) {
      LOCK();
      (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      uVar11 = p_node->len;
      uVar9 = (ulong)(uVar11 - uVar13);
      __ptr_00 = (undefined4 *)malloc(uVar9 + 0x18);
      __ptr_00[1] = uVar11 - uVar13;
      *__ptr_00 = 0;
      *(undefined4 **)(__ptr_00 + 4) = __ptr_00 + 6;
      __ptr_00[3] = 0;
      if (uVar11 - uVar13 != 0) {
        uVar8 = 0;
        do {
          *(undefined1 *)(*(long *)(__ptr_00 + 4) + uVar8) = 0;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      LOCK();
      __ptr_00[2] = 1;
      UNLOCK();
      if (uVar11 != uVar13) {
        uVar8 = 0;
        do {
          *(undefined1 *)(*(long *)(__ptr_00 + 4) + uVar8) =
               *(undefined1 *)
                ((long)&((p_node->size_table).ptr)->size + (ulong)(uVar13 + (int)uVar8));
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      *total_shift = 0;
      *(undefined4 **)this = __ptr_00;
      LOCK();
      __ptr_00[2] = __ptr_00[2] + 1;
      UNLOCK();
      LOCK();
      piVar1 = __ptr_00 + 2;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        free(__ptr_00);
      }
      LOCK();
      paVar2 = &p_node->_ref_count;
      (paVar2->super___atomic_base<unsigned_int>)._M_i =
           (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar2->super___atomic_base<unsigned_int>)._M_i != 0) {
        return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
      }
      free(p_node);
      return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<char, true>>::operator->() const [T = immutable::rrb_details::leaf_node<char, true>]"
    ;
    goto LAB_001388cf;
  }
  if (p_node == (internal_node<char,_true> *)0x0) goto LAB_001388a3;
  LOCK();
  (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i =
       (p_node->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  prVar6 = (p_node->size_table).ptr;
  if (prVar6 == (rrb_size_table<true> *)0x0) {
    uVar11 = left - (uVar13 << (bVar4 & 0x1f));
  }
  else {
    puVar3 = prVar6->size;
    uVar9 = (ulong)(uVar13 - 1);
    do {
      uVar8 = uVar9;
      uVar13 = (int)uVar8 + 1;
      uVar9 = (ulong)uVar13;
    } while (puVar3[uVar9] <= left);
    uVar11 = left;
    if (uVar13 != 0) {
      uVar11 = left - puVar3[uVar8];
    }
  }
  uVar10 = p_node->len - 1;
  local_40.ptr = (tree_node<char,_true> *)p_node->child[uVar9].ptr;
  if ((internal_node<char,_true> *)local_40.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    (((internal_node<char,_true> *)local_40.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i
         = (((internal_node<char,_true> *)local_40.ptr)->_ref_count).
           super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  uVar14 = (uint32_t)uVar9;
  rrb_drop_left_rec<char,true,5>
            ((rrb_details *)&local_50,total_shift,&local_40,uVar11,shift - 5,
             uVar14 != uVar10 || has_right);
  if (uVar14 != uVar10) {
    local_44 = p_node->len;
    uVar13 = local_44 - uVar14;
    uVar8 = (ulong)uVar13;
    local_38 = (tree_node<char,_true> *)this;
    piVar5 = (internal_node<char,_true> *)malloc(uVar8 * 8 + 0x20);
    piVar5->len = uVar13;
    piVar5->type = INTERNAL_NODE;
    (piVar5->size_table).ptr = (rrb_size_table<true> *)0x0;
    piVar5->guid = 0;
    piVar5->child = (ref<immutable::rrb_details::internal_node<char,_true>_> *)(piVar5 + 1);
    lVar12 = 0;
    memset(piVar5 + 1,0,uVar8 * 8);
    LOCK();
    (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    uVar11 = uVar14;
    for (; uVar11 = uVar11 + 1, (ulong)(uVar13 - 1) << 3 != lVar12; lVar12 = lVar12 + 8) {
      ref<immutable::rrb_details::internal_node<char,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<char,_true>_> *)
                 ((long)&piVar5->child[1].ptr + lVar12),p_node->child + uVar11);
    }
    prVar6 = (p_node->size_table).ptr;
    if (prVar6 != (rrb_size_table<true> *)0x0) {
      LOCK();
      (prVar6->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (prVar6->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    prVar7 = (rrb_size_table<true> *)malloc(uVar8 * 4 + 0x10);
    this = (rrb_details *)local_38;
    prVar7->size = (uint32_t *)(prVar7 + 1);
    prVar7->guid = 0;
    LOCK();
    (prVar7->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
    UNLOCK();
    if (prVar6 == (rrb_size_table<true> *)0x0) {
      if (local_44 != uVar14) {
        puVar3 = prVar7->size;
        uVar9 = 0;
        do {
          puVar3[uVar9] = uVar14 + 1 + (int)uVar9 << (bVar4 & 0x1f);
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
    }
    else {
      memcpy(prVar7->size,prVar6->size + uVar9,uVar8 * 4);
    }
    if (local_44 != uVar14) {
      puVar3 = prVar7->size;
      uVar9 = 0;
      do {
        puVar3[uVar9] = puVar3[uVar9] - left;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    LOCK();
    (prVar7->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (prVar7->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    __ptr = (piVar5->size_table).ptr;
    (piVar5->size_table).ptr = prVar7;
    if (__ptr != (rrb_size_table<true> *)0x0) {
      LOCK();
      paVar2 = &__ptr->_ref_count;
      (paVar2->super___atomic_base<unsigned_int>)._M_i =
           (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(__ptr);
      }
    }
    ref<immutable::rrb_details::internal_node<char,true>>::operator=
              ((ref<immutable::rrb_details::internal_node<char,true>> *)piVar5->child,&local_50);
    *total_shift = shift;
    *(internal_node<char,_true> **)this = piVar5;
    LOCK();
    (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    LOCK();
    paVar2 = &prVar7->_ref_count;
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
      free(prVar7);
    }
    if (prVar6 != (rrb_size_table<true> *)0x0) {
      LOCK();
      paVar2 = &prVar6->_ref_count;
      (paVar2->super___atomic_base<unsigned_int>)._M_i =
           (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(prVar6);
      }
    }
    release<char>(piVar5);
    goto LAB_00138875;
  }
  if (!has_right) {
    *(tree_node<char,_true> **)this = local_50.ptr;
    if ((internal_node<char,_true> *)local_50.ptr != (internal_node<char,_true> *)0x0) {
      LOCK();
      ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
           ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00138875;
  }
  piVar5 = (internal_node<char,_true> *)malloc(0x28);
  piVar5->type = INTERNAL_NODE;
  piVar5->len = 1;
  (piVar5->size_table).ptr = (rrb_size_table<true> *)0x0;
  piVar5->guid = 0;
  piVar5->child = (ref<immutable::rrb_details::internal_node<char,_true>_> *)(piVar5 + 1);
  piVar5[1].type = LEAF_NODE;
  piVar5[1].len = 0;
  LOCK();
  (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  local_58.ptr = (internal_node<char,_true> *)local_50.ptr;
  if ((internal_node<char,_true> *)local_50.ptr != (internal_node<char,_true> *)0x0) {
    LOCK();
    ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_50.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  ref<immutable::rrb_details::internal_node<char,_true>_>::operator=(piVar5->child,&local_58);
  if (shift - 5 != 0) {
    if (local_58.ptr == (internal_node<char,_true> *)0x0) {
LAB_001388a3:
      __function = 
      "T *immutable::ref<immutable::rrb_details::internal_node<char, true>>::operator->() const [T = immutable::rrb_details::internal_node<char, true>]"
      ;
LAB_001388cf:
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,__function);
    }
    if (((local_58.ptr)->size_table).ptr != (rrb_size_table<true> *)0x0) {
      prVar6 = (rrb_size_table<true> *)malloc(0x14);
      prVar6->size = (uint32_t *)(prVar6 + 1);
      prVar6->guid = 0;
      LOCK();
      (prVar6->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
      UNLOCK();
      if (local_58.ptr == (internal_node<char,_true> *)0x0) goto LAB_001388a3;
      prVar7 = ((local_58.ptr)->size_table).ptr;
      if (prVar7 == (rrb_size_table<true> *)0x0) {
        __function = 
        "T *immutable::ref<immutable::rrb_details::rrb_size_table<true>>::operator->() const [T = immutable::rrb_details::rrb_size_table<true>]"
        ;
        goto LAB_001388cf;
      }
      *prVar6->size = prVar7->size[(local_58.ptr)->len - 1];
      LOCK();
      (prVar6->_ref_count).super___atomic_base<unsigned_int>._M_i =
           (prVar6->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
      UNLOCK();
      prVar7 = (piVar5->size_table).ptr;
      (piVar5->size_table).ptr = prVar6;
      if (prVar7 != (rrb_size_table<true> *)0x0) {
        LOCK();
        paVar2 = &prVar7->_ref_count;
        (paVar2->super___atomic_base<unsigned_int>)._M_i =
             (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
        UNLOCK();
        if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
          free(prVar7);
        }
      }
      LOCK();
      paVar2 = &prVar6->_ref_count;
      (paVar2->super___atomic_base<unsigned_int>)._M_i =
           (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
      if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
        free(prVar6);
      }
    }
  }
  *total_shift = shift;
  *(internal_node<char,_true> **)this = piVar5;
  LOCK();
  (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i =
       (piVar5->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  release<char>(local_58.ptr);
  release<char>(piVar5);
LAB_00138875:
  ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&local_50);
  ref<immutable::rrb_details::tree_node<char,_true>_>::~ref(&local_40);
  release<char>(p_node);
  return (ref<immutable::rrb_details::tree_node<char,_true>_>)(tree_node<char,_true> *)this;
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }